

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die.h
# Opt level: O2

int __thiscall ORPG::Die::roll(Die *this)

{
  uint uVar1;
  uniform_int_distribution<int> dist;
  random_device rd;
  mt19937 mt;
  uniform_int_distribution<int> local_2730;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  std::random_device::random_device(&local_2728);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar1);
  local_2730._M_param._M_b = this->_MAX;
  local_2730._M_param._M_a = 1;
  uVar1 = std::uniform_int_distribution<int>::operator()(&local_2730,&local_13a0);
  if ((char)Core::VB_FLAG == '\x01') {
    printf("d%i -> %i\n",(ulong)(uint)this->_MAX,(ulong)uVar1);
  }
  std::random_device::~random_device(&local_2728);
  return uVar1;
}

Assistant:

int roll() {
                std::random_device rd;
                std::mt19937 mt(rd());
                std::uniform_int_distribution<int> dist(1, _MAX);

                auto ret = dist(mt);

                /* verbosely prints die rolls in the form "dX -> N" */
                if(Core::VB_FLAG) printf("d%i -> %i\n", _MAX, ret);

                return ret;
            }